

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# family.cc
# Opt level: O2

void __thiscall
prometheus::Family<prometheus::Gauge>::Family
          (Family<prometheus::Gauge> *this,string *name,string *help,Labels *constant_labels)

{
  bool bVar1;
  _Base_ptr p_Var2;
  invalid_argument *piVar3;
  
  (this->super_Collectable)._vptr_Collectable = (_func_int **)&PTR__Family_0013cb88;
  (this->metrics_)._M_h._M_buckets = &(this->metrics_)._M_h._M_single_bucket;
  (this->metrics_)._M_h._M_bucket_count = 1;
  (this->metrics_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->metrics_)._M_h._M_element_count = 0;
  (this->metrics_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->metrics_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->metrics_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::__cxx11::string::string((string *)&this->name_,(string *)name);
  std::__cxx11::string::string((string *)&this->help_,(string *)help);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&(this->constant_labels_)._M_t,&constant_labels->_M_t);
  *(undefined8 *)((long)&(this->mutex_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->mutex_).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->mutex_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mutex_).super___mutex_base._M_mutex + 8) = 0;
  (this->mutex_).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  bVar1 = CheckMetricName((prometheus *)&this->name_,(string *)constant_labels);
  if (!bVar1) {
    piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar3,"Invalid metric name");
    __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  p_Var2 = (this->constant_labels_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    if ((_Rb_tree_header *)p_Var2 == &(this->constant_labels_)._M_t._M_impl.super__Rb_tree_header) {
      return;
    }
    bVar1 = CheckLabelName((string *)(p_Var2 + 1),Gauge);
    if (!bVar1) break;
    p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
  }
  piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar3,"Invalid label name");
  __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Family<T>::Family(const std::string& name, const std::string& help,
                  const Labels& constant_labels)
    : name_(name), help_(help), constant_labels_(constant_labels) {
  if (!CheckMetricName(name_)) {
    throw std::invalid_argument("Invalid metric name");
  }
  for (auto& label_pair : constant_labels_) {
    auto& label_name = label_pair.first;
    if (!CheckLabelName(label_name, T::metric_type)) {
      throw std::invalid_argument("Invalid label name");
    }
  }
}